

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O1

void __thiscall
dxil_spv::SPIRVModule::Impl::register_active_variable(Impl *this,StorageClass storage,Id id)

{
  Instruction *pIVar1;
  iterator __position;
  bool bVar2;
  bool bVar3;
  uint local_4;
  
  if (this->override_spirv_version == 0) {
    bVar3 = true;
    if (5 < this->execution_model - ExecutionModelRayGenerationKHR) {
      bVar3 = (this->execution_model & ~ExecutionModelTessellationControl) == ExecutionModelTaskEXT;
    }
  }
  else {
    bVar3 = 0x103ff < this->override_spirv_version;
  }
  bVar2 = (storage & ~StorageClassUniform) == StorageClassInput;
  if (bVar3) {
    bVar2 = storage != StorageClassFunction;
  }
  if (bVar2) {
    pIVar1 = this->entry_point;
    __position._M_current =
         (pIVar1->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pIVar1->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &pIVar1->operands,__position,&local_4);
    }
    else {
      *__position._M_current = id;
      (pIVar1->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

bool SPIRVModule::Impl::spirv_requires_14() const
{
	static const uint32_t Version_1_4 = 0x00010400;
	if (override_spirv_version)
	{
		return override_spirv_version >= Version_1_4;
	}
	else
	{
		return execution_model_is_ray_tracing() || execution_model == spv::ExecutionModelMeshEXT ||
		       execution_model == spv::ExecutionModelTaskEXT;
	}
}